

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlSetNs(xmlNodePtr node,xmlNsPtr ns)

{
  if ((node != (xmlNodePtr)0x0) && (node->type - XML_ELEMENT_NODE < 2)) {
    node->ns = ns;
  }
  return;
}

Assistant:

void
xmlSetNs(xmlNodePtr node, xmlNsPtr ns) {
    if (node == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlSetNs: node == NULL\n");
#endif
	return;
    }
    if ((node->type == XML_ELEMENT_NODE) ||
        (node->type == XML_ATTRIBUTE_NODE))
	node->ns = ns;
}